

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,bool *value,bool *defval)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  char cVar4;
  Value *pVVar5;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    pVVar5 = FReader::FindKey(arc->r,key);
    if (pVVar5 != (Value *)0x0) {
      uVar1 = (pVVar5->data_).f.flags;
      if ((uVar1 & 8) == 0) {
        __assert_fail("val->IsBool()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x499,"FSerializer &Serialize(FSerializer &, const char *, bool &, bool *)");
      }
      *value = uVar1 == 10;
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if (uVar2 == 0) {
      cVar4 = '\0';
    }
    else {
      cVar4 = (pFVar3->mInObject).Array[uVar2 - 1];
    }
    if (((defval == (bool *)0x0) || (cVar4 == '\0')) || (*value != *defval)) {
      FSerializer::WriteKey(arc,key);
      FWriter::Bool(arc->w,*value);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, bool &value, bool *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Bool(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsBool());
			if (val->IsBool())
			{
				value = val->GetBool();
			}
			else
			{
				Printf(TEXTCOLOR_RED "boolean type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}